

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O2

civil_time<absl::lts_20240722::time_internal::cctz::detail::day_tag> __thiscall
absl::lts_20240722::time_internal::cctz::detail::operator-
          (detail *this,civil_time<absl::lts_20240722::time_internal::cctz::detail::day_tag> a,
          diff_t n)

{
  unkuint10 Var1;
  long lVar2;
  ulong uVar3;
  fields fVar4;
  civil_time<absl::lts_20240722::time_internal::cctz::detail::day_tag> cVar5;
  
  uVar3 = a.f_.y;
  if (a.f_._8_8_ == -0x8000000000000000) {
    fVar4 = step(this,uVar3,0x7fffffffffffffff);
    this = (detail *)fVar4.y;
    uVar3 = fVar4._8_8_ & 0xffffffffff;
    lVar2 = 1;
  }
  else {
    lVar2 = -a.f_._8_8_;
  }
  fVar4 = step(this,uVar3,lVar2);
  Var1 = fVar4._0_10_;
  cVar5.f_.hh = '\0';
  cVar5.f_.mm = '\0';
  cVar5.f_.ss = '\0';
  cVar5.f_._13_3_ = 0;
  cVar5.f_.y = (long)Var1;
  cVar5.f_.m = (char)(Var1 >> 0x40);
  cVar5.f_.d = (char)(Var1 >> 0x48);
  return (civil_time<absl::lts_20240722::time_internal::cctz::detail::day_tag>)cVar5.f_;
}

Assistant:

CONSTEXPR_F civil_time operator-(civil_time a, diff_t n) noexcept {
    return n != (std::numeric_limits<diff_t>::min)()
               ? civil_time(step(T{}, a.f_, -n))
               : civil_time(step(T{}, step(T{}, a.f_, -(n + 1)), 1));
  }